

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestingFixture.cpp
# Opt level: O0

void __thiscall TestTestingFixture::~TestTestingFixture(TestTestingFixture *this)

{
  TestTestingFixture *this_local;
  
  this->_vptr_TestTestingFixture = (_func_int **)&PTR__TestTestingFixture_0042f4d8;
  (*this->registry_->_vptr_TestRegistry[0x17])(this->registry_,0);
  clearExecFunction(this);
  if (this->registry_ != (TestRegistry *)0x0) {
    (*this->registry_->_vptr_TestRegistry[1])();
  }
  if (this->result_ != (TestResult *)0x0) {
    (*this->result_->_vptr_TestResult[1])();
  }
  if (this->output_ != (StringBufferTestOutput *)0x0) {
    (*(this->output_->super_TestOutput)._vptr_TestOutput[1])();
  }
  if (this->genTest_ != (ExecFunctionTestShell *)0x0) {
    (*(this->genTest_->super_UtestShell)._vptr_UtestShell[1])();
  }
  return;
}

Assistant:

TestTestingFixture::~TestTestingFixture()
{
    registry_->setCurrentRegistry(NULLPTR);
    clearExecFunction();
    delete registry_;
    delete result_;
    delete output_;
    delete genTest_;
}